

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

HighsStatus
assessBounds(HighsOptions *options,char *type,HighsInt ml_ix_os,
            HighsIndexCollection *index_collection,vector<double,_std::allocator<double>_> *lower,
            vector<double,_std::allocator<double>_> *upper,double infinite_bound,
            HighsVarType *integrality)

{
  double dVar1;
  pointer pdVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  HighsStatus HVar10;
  long lVar11;
  int iVar12;
  ulong in_XMM0_Qb;
  HighsInt to_k;
  HighsInt from_k;
  int local_a8;
  uint local_a4;
  int local_9c;
  vector<double,_std::allocator<double>_> *local_98;
  vector<double,_std::allocator<double>_> *local_90;
  HighsLogOptions *local_88;
  HighsInt local_7c;
  double local_78;
  ulong uStack_70;
  HighsIndexCollection *local_60;
  double local_58;
  ulong uStack_50;
  HighsOptions *local_40;
  int local_34;
  
  local_98 = upper;
  local_7c = ml_ix_os;
  local_78 = infinite_bound;
  uStack_70 = in_XMM0_Qb;
  limits(index_collection,&local_34,&local_9c);
  HVar10 = kOk;
  if (local_34 <= local_9c) {
    local_a8 = 0;
    local_a4 = 0;
    HVar10 = kOk;
    if (local_34 <= local_9c) {
      local_58 = -local_78;
      uStack_50 = uStack_70 ^ 0x8000000000000000;
      local_88 = &(options->super_HighsOptionsStruct).log_options;
      lVar11 = (long)local_34 + -1;
      bVar5 = false;
      iVar12 = -1;
      bVar4 = 0;
      local_a4 = 0;
      local_a8 = 0;
      iVar9 = local_34;
      local_90 = lower;
      local_60 = index_collection;
      local_40 = options;
      do {
        iVar7 = iVar9;
        if ((index_collection->is_interval_ == false) && (index_collection->is_mask_ == false)) {
          iVar7 = (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11 + 1];
        }
        iVar12 = iVar12 + 1;
        if (index_collection->is_interval_ == false) {
          iVar12 = iVar9;
        }
        if ((index_collection->is_mask_ != true) ||
           ((index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar7] != 0)) {
          bVar3 = highs_isInfinity(-(lower->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start[iVar12]);
          pvVar6 = local_98;
          if ((!bVar3) &&
             (pdVar2 = (lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start, pdVar2[iVar12] <= local_58)) {
            pdVar2[iVar12] = -INFINITY;
            local_a8 = local_a8 + 1;
          }
          bVar3 = highs_isInfinity((local_98->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_start[iVar12]);
          lower = local_90;
          if ((!bVar3) &&
             (pdVar2 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start, local_78 <= pdVar2[iVar12])) {
            pdVar2[iVar12] = INFINITY;
            local_a4 = local_a4 + 1;
          }
          uVar8 = iVar7 + local_7c;
          if (((integrality == (HighsVarType *)0x0) ||
              ((integrality[iVar12] & ~kInteger) != kSemiContinuous)) &&
             ((pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar12] <
              (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar12])) {
            highsLogUser(local_88,kWarning,"%3s  %12d has inconsistent bounds [%12g, %12g]\n",type,
                         (ulong)uVar8);
            bVar4 = 1;
            pvVar6 = local_98;
          }
          dVar1 = (lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar12];
          if (local_78 <= dVar1) {
            highsLogUser(local_88,kError,"%3s  %12d has lower bound of %12g >= %12g\n",dVar1,
                         local_78,type,(ulong)uVar8);
            bVar5 = true;
            pvVar6 = local_98;
          }
          dVar1 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar12];
          index_collection = local_60;
          if (dVar1 <= local_58) {
            highsLogUser(local_88,kError,"%3s  %12d has upper bound of %12g <= %12g\n",dVar1,
                         local_58,type,(ulong)uVar8);
            bVar5 = true;
            index_collection = local_60;
          }
        }
        lVar11 = lVar11 + 1;
        iVar9 = iVar9 + 1;
      } while (lVar11 < local_9c);
      options = local_40;
      HVar10 = kError;
      if (!bVar5) {
        HVar10 = (uint)bVar4;
      }
    }
    if (local_a8 != 0) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kInfo,
                   "%3ss:%12d lower bounds    less than or equal to %12g are treated as -Infinity\n"
                   ,-local_78,type);
    }
    if (local_a4 != 0) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kInfo,
                   "%3ss:%12d upper bounds greater than or equal to %12g are treated as +Infinity\n"
                   ,local_78,type,(ulong)local_a4);
    }
  }
  return HVar10;
}

Assistant:

HighsStatus assessBounds(const HighsOptions& options, const char* type,
                         const HighsInt ml_ix_os,
                         const HighsIndexCollection& index_collection,
                         vector<double>& lower, vector<double>& upper,
                         const double infinite_bound,
                         const HighsVarType* integrality) {
  HighsStatus return_status = HighsStatus::kOk;
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return HighsStatus::kOk;

  return_status = HighsStatus::kOk;
  bool error_found = false;
  bool warning_found = false;
  // Work through the data to be assessed.
  //
  // Loop is k \in [from_k...to_k) covering the entries in the
  // interval, set or mask to be considered.
  //
  // For an interval or mask, these values of k are the row/column
  // indices to be considered in a local sense, as well as the entries
  // in the lower and upper bound data to be assessed
  //
  // For a set, these values of k are the indices in the set, from
  // which the indices to be considered in a local sense are
  // drawn. The entries in the lower and
  // upper bound data to be assessed correspond to the values of
  // k.
  //
  // Adding the value of ml_ix_os to local_ix yields the value of
  // ml_ix, being the index in a global (whole-model) sense. This is
  // necessary when assessing the bounds of rows/columns being added
  // to a model, since they are specified using an interval
  // [0...num_new_row/col) which must be offset by the current number
  // of rows/columns (generically indices) in the model.
  //
  HighsInt num_infinite_lower_bound = 0;
  HighsInt num_infinite_upper_bound = 0;
  HighsInt local_ix;
  HighsInt ml_ix;
  HighsInt usr_ix = -1;
  for (HighsInt k = from_k; k < to_k + 1; k++) {
    if (index_collection.is_interval_ || index_collection.is_mask_) {
      local_ix = k;
    } else {
      local_ix = index_collection.set_[k];
    }
    if (index_collection.is_interval_) {
      usr_ix++;
    } else {
      usr_ix = k;
    }
    ml_ix = ml_ix_os + local_ix;
    if (index_collection.is_mask_ && !index_collection.mask_[local_ix])
      continue;

    if (!highs_isInfinity(-lower[usr_ix])) {
      // Check whether a finite lower bound will be treated as -Infinity
      bool infinite_lower_bound = lower[usr_ix] <= -infinite_bound;
      if (infinite_lower_bound) {
        lower[usr_ix] = -kHighsInf;
        num_infinite_lower_bound++;
      }
    }
    if (!highs_isInfinity(upper[usr_ix])) {
      // Check whether a finite upper bound will be treated as Infinity
      bool infinite_upper_bound = upper[usr_ix] >= infinite_bound;
      if (infinite_upper_bound) {
        upper[usr_ix] = kHighsInf;
        num_infinite_upper_bound++;
      }
    }
    // Check that the lower bound does not exceed the upper bound
    bool legalLowerUpperBound = lower[usr_ix] <= upper[usr_ix];
    if (integrality) {
      // Legal for semi-variables to have inconsistent bounds
      if (integrality[usr_ix] == HighsVarType::kSemiContinuous ||
          integrality[usr_ix] == HighsVarType::kSemiInteger)
        legalLowerUpperBound = true;
    }
    if (!legalLowerUpperBound) {
      // Leave inconsistent bounds to be used to deduce infeasibility
      highsLogUser(options.log_options, HighsLogType::kWarning,
                   "%3s  %12" HIGHSINT_FORMAT
                   " has inconsistent bounds [%12g, %12g]\n",
                   type, ml_ix, lower[usr_ix], upper[usr_ix]);
      warning_found = true;
    }
    // Check that the lower bound is not as much as +Infinity
    bool legalLowerBound = lower[usr_ix] < infinite_bound;
    if (!legalLowerBound) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "%3s  %12" HIGHSINT_FORMAT
                   " has lower bound of %12g >= %12g\n",
                   type, ml_ix, lower[usr_ix], infinite_bound);
      error_found = true;
    }
    // Check that the upper bound is not as little as -Infinity
    bool legalUpperBound = upper[usr_ix] > -infinite_bound;
    if (!legalUpperBound) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "%3s  %12" HIGHSINT_FORMAT
                   " has upper bound of %12g <= %12g\n",
                   type, ml_ix, upper[usr_ix], -infinite_bound);
      error_found = true;
    }
  }
  if (num_infinite_lower_bound) {
    highsLogUser(options.log_options, HighsLogType::kInfo,
                 "%3ss:%12" HIGHSINT_FORMAT
                 " lower bounds    less than or equal to %12g are treated as "
                 "-Infinity\n",
                 type, num_infinite_lower_bound, -infinite_bound);
  }
  if (num_infinite_upper_bound) {
    highsLogUser(options.log_options, HighsLogType::kInfo,
                 "%3ss:%12" HIGHSINT_FORMAT
                 " upper bounds greater than or equal to %12g are treated as "
                 "+Infinity\n",
                 type, num_infinite_upper_bound, infinite_bound);
  }

  if (error_found)
    return_status = HighsStatus::kError;
  else if (warning_found)
    return_status = HighsStatus::kWarning;
  else
    return_status = HighsStatus::kOk;

  return return_status;
}